

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadExtend
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,SIMDLoad *curr)

{
  uint uVar1;
  Literal *this_00;
  array<wasm::Literal,_8UL> local_328;
  array<wasm::Literal,_4UL> local_268;
  undefined1 auStack_208 [8];
  array<wasm::Literal,_2UL> lanes;
  undefined1 local_148 [8];
  Flow flow;
  Address local_d0;
  Address memorySize;
  MemoryInstanceInfo info;
  Literal local_98;
  Literal local_80;
  MemoryInstanceInfo *local_68;
  anon_class_16_2_3ef7c955 loadLane;
  anon_class_40_5_49a3c194 fillLanes;
  Address src;
  SIMDLoad *curr_local;
  
  src.addr = (address64_t)curr;
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_148,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x28));
  if (flow.breakTo.super_IString.str._M_len == 0) {
    this_00 = Flow::getSingleValue((Flow *)local_148);
    uVar1 = Literal::geti32(this_00);
    fillLanes.memorySize = (Address *)(ulong)uVar1;
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)&memorySize,this,(Name)((IString *)(src.addr + 0x30))->str);
    local_68 = (MemoryInstanceInfo *)&src;
    loadLane.curr = (SIMDLoad **)&memorySize;
    local_d0 = getMemorySize(memorySize.addr,(Name)info._0_16_);
    fillLanes.src = &local_d0;
    loadLane.info = (MemoryInstanceInfo *)&stack0xffffffffffffff98;
    fillLanes.curr = (SIMDLoad **)&fillLanes.memorySize;
    uVar1 = *(uint *)(src.addr + 0x10);
    fillLanes.loadLane = (anon_class_16_2_3ef7c955 *)&memorySize;
    fillLanes.info = (MemoryInstanceInfo *)&src;
    if (9 < uVar1) {
LAB_0013dc4c:
      ::wasm::handle_unreachable
                ("unexpected op",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                 ,0xcdb);
    }
    if ((0x30U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0xc0U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0x300U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0013dc4c;
        lanes._M_elems[1].field_0.i64 = 0;
        lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].type.id = 0;
        auStack_208 = (undefined1  [8])0x0;
        lanes._M_elems[0].field_0.i64 = 0;
        std::array<wasm::Literal,_2UL>::array
                  ((array<wasm::Literal,_2UL> *)&flow.breakTo.super_IString.str._M_str,
                   (array<wasm::Literal,_2UL> *)auStack_208);
        visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                  (&local_80,&loadLane.info,
                   (array<wasm::Literal,_2UL> *)&flow.breakTo.super_IString.str._M_str,4);
        Flow::Flow(__return_storage_ptr__,&local_80);
        ::wasm::Literal::~Literal(&local_80);
        std::array<wasm::Literal,_2UL>::~array
                  ((array<wasm::Literal,_2UL> *)&flow.breakTo.super_IString.str._M_str);
        std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)auStack_208);
      }
      else {
        lanes._M_elems[1].type.id = 0;
        lanes._M_elems[1].field_0.i64 = 0;
        lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].type.id = 0;
        auStack_208 = (undefined1  [8])0x0;
        lanes._M_elems[0].field_0.i64 = 0;
        std::array<wasm::Literal,_4UL>::array(&local_268,(array<wasm::Literal,_4UL> *)auStack_208);
        visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                  (&local_98,&loadLane.info,&local_268,2);
        Flow::Flow(__return_storage_ptr__,&local_98);
        ::wasm::Literal::~Literal(&local_98);
        std::array<wasm::Literal,_4UL>::~array(&local_268);
        std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)auStack_208);
      }
    }
    else {
      memset((array<wasm::Literal,_8UL> *)auStack_208,0,0xc0);
      std::array<wasm::Literal,_8UL>::array(&local_328,(array<wasm::Literal,_8UL> *)auStack_208);
      visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                ((Literal *)&info.name.super_IString.str._M_str,&loadLane.info,&local_328,1);
      Flow::Flow(__return_storage_ptr__,(Literal *)&info.name.super_IString.str._M_str);
      ::wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
      std::array<wasm::Literal,_8UL>::~array(&local_328);
      std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)auStack_208);
    }
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_148);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_148);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadExtend(SIMDLoad* curr) {
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    Address src(uint32_t(flow.getSingleValue().geti32()));
    auto info = getMemoryInstanceInfo(curr->memory);
    auto loadLane = [&](Address addr) {
      switch (curr->op) {
        case Load8x8SVec128:
          return Literal(
            int32_t(info.instance->externalInterface->load8s(addr, info.name)));
        case Load8x8UVec128:
          return Literal(
            int32_t(info.instance->externalInterface->load8u(addr, info.name)));
        case Load16x4SVec128:
          return Literal(int32_t(
            info.instance->externalInterface->load16s(addr, info.name)));
        case Load16x4UVec128:
          return Literal(int32_t(
            info.instance->externalInterface->load16u(addr, info.name)));
        case Load32x2SVec128:
          return Literal(int64_t(
            info.instance->externalInterface->load32s(addr, info.name)));
        case Load32x2UVec128:
          return Literal(int64_t(
            info.instance->externalInterface->load32u(addr, info.name)));
        default:
          WASM_UNREACHABLE("unexpected op");
      }
      WASM_UNREACHABLE("invalid op");
    };
    auto memorySize = info.instance->getMemorySize(info.name);
    auto fillLanes = [&](auto lanes, size_t laneBytes) {
      for (auto& lane : lanes) {
        lane = loadLane(info.instance->getFinalAddress(
          curr, Literal(uint32_t(src)), laneBytes, memorySize));
        src = Address(uint32_t(src) + laneBytes);
      }
      return Literal(lanes);
    };
    switch (curr->op) {
      case Load8x8SVec128:
      case Load8x8UVec128: {
        std::array<Literal, 8> lanes;
        return fillLanes(lanes, 1);
      }
      case Load16x4SVec128:
      case Load16x4UVec128: {
        std::array<Literal, 4> lanes;
        return fillLanes(lanes, 2);
      }
      case Load32x2SVec128:
      case Load32x2UVec128: {
        std::array<Literal, 2> lanes;
        return fillLanes(lanes, 4);
      }
      default:
        WASM_UNREACHABLE("unexpected op");
    }
    WASM_UNREACHABLE("invalid op");
  }